

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int ncnn::gemm_x86(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,int transB,
                  int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
                  int nT,Option *opt)

{
  int iVar1;
  int *piVar2;
  undefined1 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000030;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  Mat *CT_tile;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  Mat ATX;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  int K;
  int M;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined1 in_stack_00000ee3;
  int in_stack_00000ee4;
  Mat *in_stack_00000ee8;
  Mat *in_stack_00000ef0;
  Mat *in_stack_00000ef8;
  Mat *in_stack_00000f00;
  Mat *in_stack_00000f08;
  undefined4 in_stack_fffffffffffff3b4;
  undefined4 in_stack_fffffffffffff3b8;
  undefined4 in_stack_fffffffffffff3bc;
  int in_stack_fffffffffffff3c4;
  int in_stack_fffffffffffff3c8;
  int in_stack_fffffffffffff3cc;
  Mat *in_stack_fffffffffffff3d0;
  undefined8 in_stack_fffffffffffff410;
  undefined8 *puVar3;
  int in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  undefined8 in_stack_fffffffffffff420;
  void **ppvVar4;
  undefined7 in_stack_fffffffffffff430;
  undefined1 in_stack_fffffffffffff437;
  int *in_stack_fffffffffffff438;
  int *in_stack_fffffffffffff440;
  int in_stack_fffffffffffff448;
  undefined1 *local_b68;
  int local_b14;
  int local_b10;
  int local_b0c;
  int local_b08;
  bool local_a9d;
  bool local_a75;
  int local_a74;
  int local_a70;
  int local_a6c;
  int local_a68;
  int local_a64;
  int local_a60;
  undefined8 local_a58;
  undefined8 local_a50;
  undefined8 local_a48;
  undefined4 local_a40;
  Mat *local_a38;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined4 local_a20;
  undefined8 local_a18;
  void *local_a10;
  int *local_a08;
  long local_a00;
  undefined4 local_9f8;
  Mat *local_9f0;
  undefined4 local_9e8;
  int local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  long local_9d0;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined4 local_9b0;
  long *local_9a8;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined8 local_988;
  void *local_980;
  int *local_978;
  long local_970;
  undefined4 local_968;
  long *local_960;
  undefined4 local_958;
  int local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  long local_940;
  int local_934;
  int local_930;
  int local_92c;
  undefined1 *local_928;
  int local_91c;
  int local_918;
  int local_914;
  Mat *local_910;
  Mat *local_908;
  long local_900;
  undefined4 local_8f8;
  long *local_8f0;
  int local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  int in_stack_fffffffffffff728;
  int in_stack_fffffffffffff72c;
  undefined8 in_stack_fffffffffffff730;
  Mat *AT;
  Mat *A_00;
  long *local_8a8;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  void *local_868;
  int *local_860;
  long local_858;
  undefined4 local_850;
  long *local_848;
  int local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  int local_830;
  long local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined4 local_808;
  Mat *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  void *local_7d8;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  undefined8 uVar5;
  int in_stack_fffffffffffff838;
  int in_stack_fffffffffffff83c;
  undefined4 uVar6;
  Mat *in_stack_fffffffffffff840;
  Mat *in_stack_fffffffffffff848;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  int local_778;
  int local_774;
  int local_770;
  int local_76c;
  void *local_768;
  int *local_760;
  long local_758;
  undefined4 local_750;
  Mat *local_748;
  undefined4 local_740;
  int local_73c;
  undefined4 local_738;
  undefined4 local_734;
  int local_730;
  long local_728;
  undefined4 local_720;
  void *local_710;
  int *local_708;
  long local_700;
  undefined4 local_6f8;
  long *local_6f0;
  undefined4 local_6e8;
  int local_6e4;
  undefined4 local_6e0;
  undefined4 local_6dc;
  int local_6d8;
  long local_6d0;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  undefined1 *local_690;
  long local_680;
  int local_674;
  void **local_670;
  undefined1 *local_668;
  undefined8 *local_660;
  void **local_650;
  Mat **local_640;
  undefined8 *local_630;
  undefined8 *local_620;
  void **local_610;
  void **local_600;
  undefined8 *local_5f0;
  undefined8 in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  Mat *in_stack_fffffffffffffa30;
  Mat *in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  Mat *in_stack_fffffffffffffb68;
  Mat *in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  undefined8 in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  
  uVar5 = CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830);
  if (in_R9D == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a64 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a64 = *(int *)(in_RDI + 0x30);
    }
    local_a60 = local_a64 * *(int *)(in_RDI + 0x18);
  }
  else {
    local_a60 = *(int *)(in_RDI + 0x2c);
  }
  local_6a4 = local_a60;
  if (in_R9D == 0) {
    local_a6c = *(int *)(in_RDI + 0x2c);
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a68 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a68 = *(int *)(in_RDI + 0x30);
    }
    local_a6c = local_a68 * *(int *)(in_RDI + 0x18);
  }
  local_6a8 = local_a6c;
  if (in_stack_00000008 == 0) {
    local_a74 = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_a70 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_a70 = *(int *)(in_RSI + 0x30);
    }
    local_a74 = local_a70 * *(int *)(in_RSI + 0x18);
  }
  local_6ac = local_a74;
  local_6a0 = in_R9D;
  local_69c = in_R8D;
  local_690 = in_RDX;
  local_680 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff420 >> 0x20),(int)in_stack_fffffffffffff420,
             in_stack_fffffffffffff41c,in_stack_fffffffffffff418,
             (int)((ulong)in_stack_fffffffffffff410 >> 0x20),(int)in_stack_fffffffffffff410,
             (int *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
             in_stack_fffffffffffff438,in_stack_fffffffffffff440,in_stack_fffffffffffff448);
  local_6bc = (local_6a4 + local_6b0 + -1) / local_6b0;
  local_6c0 = (local_6ac + local_6b4 + -1) / local_6b4;
  local_6c4 = (local_6a8 + local_6b8 + -1) / local_6b8;
  local_710 = (void *)0x0;
  local_708 = (int *)0x0;
  local_700 = 0;
  local_6f8 = 0;
  local_6f0 = (long *)0x0;
  local_6e8 = 0;
  local_6e4 = 0;
  local_6e0 = 0;
  local_6dc = 0;
  local_6d8 = 0;
  local_6d0 = 0;
  Mat::create(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8,
              in_stack_fffffffffffff3c4,
              CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
              (Allocator *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_00000030));
  local_a75 = local_710 == (void *)0x0 || local_6d0 * local_6d8 == 0;
  if (local_a75) {
    local_674 = -100;
    local_720 = 1;
  }
  else {
    local_768 = (void *)0x0;
    local_760 = (int *)0x0;
    local_758 = 0;
    local_750 = 0;
    local_748 = (Mat *)0x0;
    local_740 = 0;
    local_73c = 0;
    local_738 = 0;
    local_734 = 0;
    local_730 = 0;
    local_728 = 0;
    Mat::create(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8,
                in_stack_fffffffffffff3c4,
                CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_00000030));
    local_a9d = local_768 == (void *)0x0 || local_728 * local_730 == 0;
    if (local_a9d) {
      local_674 = -100;
      local_720 = 1;
    }
    else {
      local_76c = local_6c0 * local_6c4;
      for (local_770 = 0; local_770 < local_76c; local_770 = local_770 + 1) {
        local_774 = local_770 / local_6c4;
        local_778 = local_770 % local_6c4;
        local_77c = local_774 * local_6b4;
        local_780 = local_778 * local_6b8;
        local_788 = local_6ac - local_77c;
        piVar2 = std::min<int>(&local_788,&local_6b4);
        local_784 = *piVar2;
        local_790 = local_6a8 - local_780;
        piVar2 = std::min<int>(&local_790,&local_6b8);
        local_78c = *piVar2;
        local_7d8 = (void *)((long)local_768 +
                            (long)local_73c * (long)(local_780 / local_6b8) * local_758 +
                            local_728 * (local_77c / local_6b4) * local_758);
        local_660 = &local_820;
        piVar2 = (int *)0x0;
        local_800 = local_748;
        local_820 = 0;
        local_810 = 0;
        local_808 = 0;
        local_7f8 = 0;
        local_7f4 = 0;
        local_7f0 = 0;
        local_7ec = 0;
        local_7e8 = 0;
        local_7e0 = 0;
        local_818 = 0;
        in_stack_fffffffffffff848 = local_748;
        if (in_stack_00000008 == 0) {
          transpose_pack_B_tile
                    (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb64,
                     in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                     (int)in_stack_fffffffffffffb58);
        }
        else {
          pack_B_tile(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                      (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),(int)in_stack_fffffffffffffc28
                      ,in_stack_fffffffffffffc24,in_stack_fffffffffffffc20);
        }
        local_650 = &local_7d8;
        if (piVar2 != (int *)0x0) {
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (in_stack_fffffffffffff848 == (Mat *)0x0) {
              if (local_7d8 != (void *)0x0) {
                free(local_7d8);
              }
            }
            else {
              (**(code **)((long)in_stack_fffffffffffff848->data + 0x18))
                        (in_stack_fffffffffffff848,local_7d8);
            }
          }
        }
        local_7d8 = (void *)0x0;
        in_stack_fffffffffffff83c = 0;
        in_stack_fffffffffffff838 = 0;
        uVar6 = 0;
        uVar5 = 0;
      }
      local_670 = &local_868;
      local_868 = (void *)0x0;
      local_860 = (int *)0x0;
      local_858 = 0;
      local_850 = 0;
      local_848 = (long *)0x0;
      local_840 = 0;
      local_83c = 0;
      local_838 = 0;
      local_834 = 0;
      local_830 = 0;
      local_828 = 0;
      if ((((local_6b8 < local_6a8) || (local_69c == 3)) || (in_stack_00000010 != 0)) &&
         (Mat::create(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8,
                      in_stack_fffffffffffff3c4,
                      CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_00000030)),
         local_868 == (void *)0x0 || local_828 * local_830 == 0)) {
        local_674 = -100;
      }
      else {
        for (local_86c = 0; local_86c < local_6bc; local_86c = local_86c + 1) {
          local_870 = local_86c * local_6b0;
          if (local_6a0 == 0) {
            if (*(int *)(local_680 + 0x28) == 3) {
              local_b0c = *(int *)(local_680 + 0x38);
            }
            else {
              local_b0c = *(int *)(local_680 + 0x30);
            }
            local_b08 = local_b0c * *(int *)(local_680 + 0x18);
          }
          else {
            local_b08 = *(int *)(local_680 + 0x2c);
          }
          local_874 = local_b08;
          if (local_6a0 == 0) {
            local_b14 = *(int *)(local_680 + 0x2c);
          }
          else {
            if (*(int *)(local_680 + 0x28) == 3) {
              local_b10 = *(int *)(local_680 + 0x38);
            }
            else {
              local_b10 = *(int *)(local_680 + 0x30);
            }
            local_b14 = local_b10 * *(int *)(local_680 + 0x18);
          }
          local_878 = local_b14;
          local_880 = local_b08 - local_870;
          piVar2 = std::min<int>(&local_880,&local_6b0);
          local_87c = *piVar2;
          local_668 = &stack0xfffffffffffff738;
          AT = (Mat *)0x0;
          A_00 = (Mat *)0x0;
          local_8a8 = (long *)0x0;
          if (((local_6b8 < local_878) || (local_69c == 3)) || (in_stack_00000010 != 0)) {
            iVar1 = get_omp_thread_num();
            local_910 = (Mat *)((long)local_868 + local_828 * iVar1 * local_858);
            local_908 = (Mat *)0x0;
            local_900 = local_858;
            local_8f8 = local_850;
            local_8f0 = local_848;
            local_8e4 = local_83c;
            local_8e0 = local_838;
            local_8dc = 1;
            local_8e8 = local_840 + -1;
            if ((Mat **)&stack0xfffffffffffff738 != &local_910) {
              if (A_00 != (Mat *)0x0) {
                LOCK();
                iVar1 = *(int *)&A_00->data;
                *(int *)&A_00->data = *(int *)&A_00->data + -1;
                UNLOCK();
                if ((iVar1 == 1) && (AT != (Mat *)0x0)) {
                  free(AT);
                }
              }
              local_8a8 = local_8f0;
              AT = local_910;
              A_00 = local_908;
            }
            local_640 = &local_910;
            if (local_908 != (Mat *)0x0) {
              LOCK();
              iVar1 = *(int *)&local_908->data;
              *(int *)&local_908->data = *(int *)&local_908->data + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_8f0 == (long *)0x0) {
                  if (local_910 != (Mat *)0x0) {
                    free(local_910);
                  }
                }
                else {
                  (**(code **)(*local_8f0 + 0x18))(local_8f0,local_910);
                }
              }
            }
            local_910 = (Mat *)0x0;
            local_900 = 0;
            local_8f8 = 0;
            local_8e8 = 0;
            local_8e4 = 0;
            local_8e0 = 0;
            local_8dc = 0;
            in_stack_fffffffffffff728 = 0;
            in_stack_fffffffffffff730 = 0;
            local_908 = (Mat *)0x0;
          }
          for (local_914 = 0; local_914 < local_6ac; local_914 = local_6b4 + local_914) {
            local_91c = local_6ac - local_914;
            piVar2 = std::min<int>(&local_91c,&local_6b4);
            local_918 = *piVar2;
            if (local_69c == 3) {
              pack_A_tile(A_00,AT,(int)((ulong)in_stack_fffffffffffff730 >> 0x20),
                          (int)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
                          in_stack_fffffffffffff728);
            }
            if (local_69c == 3) {
              local_b68 = &stack0xfffffffffffff738;
            }
            else {
              local_b68 = local_690;
            }
            local_928 = local_b68;
            for (local_92c = 0; local_92c < local_878; local_92c = local_6b8 + local_92c) {
              local_934 = local_878 - local_92c;
              piVar2 = std::min<int>(&local_934,&local_6b8);
              local_930 = *piVar2;
              iVar1 = get_omp_thread_num();
              local_980 = (void *)((long)local_710 +
                                  (long)local_6e4 * (long)(local_92c / local_6b8) * local_700 +
                                  local_6d0 * iVar1 * local_700);
              local_940 = (long)local_6e4;
              local_630 = &local_9c8;
              local_a10 = (void *)((long)local_768 +
                                  (long)local_73c * (long)(local_92c / local_6b8) * local_758 +
                                  local_728 * (local_914 / local_6b4) * local_758);
              local_9d0 = (long)local_73c;
              local_620 = &local_a58;
              local_948 = 1;
              local_94c = 1;
              local_950 = 1;
              local_954 = local_6e4;
              local_958 = 2;
              local_960 = local_6f0;
              local_968 = local_6f8;
              local_970 = local_700;
              local_978 = (int *)0x0;
              local_990 = 0;
              local_994 = 0;
              local_998 = 0;
              local_99c = 0;
              local_9a8 = local_6f0;
              local_9b0 = 0;
              local_9b8 = 0;
              local_9c0 = 0;
              local_9c8 = 0;
              local_9d8 = 1;
              local_9dc = 1;
              local_9e0 = 1;
              local_9e4 = local_73c;
              local_9e8 = 2;
              local_9f0 = local_748;
              local_9f8 = local_750;
              local_a00 = local_758;
              local_a08 = (int *)0x0;
              local_a38 = local_748;
              local_988 = 0;
              local_9a0 = 0;
              local_a58 = 0;
              local_a48 = 0;
              local_a40 = 0;
              local_a30 = 0;
              local_a2c = 0;
              local_a28 = 0;
              local_a24 = 0;
              local_a20 = 0;
              local_a18 = 0;
              local_a50 = 0;
              if (local_914 == 0) {
                if (local_6a0 == 0) {
                  pack_A_tile(A_00,AT,(int)((ulong)in_stack_fffffffffffff730 >> 0x20),
                              (int)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
                              in_stack_fffffffffffff728);
                }
                else {
                  transpose_pack_A_tile
                            (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                             in_stack_fffffffffffff83c,in_stack_fffffffffffff838,
                             (int)((ulong)uVar5 >> 0x20),(int)uVar5);
                }
              }
              gemm_transB_packed_tile
                        (in_stack_00000f08,in_stack_00000f00,in_stack_00000ef8,in_stack_00000ef0,
                         in_stack_00000ee8,in_stack_00000ee4,local_87c,local_914,local_918,local_92c
                         ,local_930,
                         (uint)(in_stack_00000010 == 0 && local_878 <= local_92c + local_6b8),
                         (bool)in_stack_00000ee3);
              local_610 = &local_a10;
              if (local_a08 != (int *)0x0) {
                LOCK();
                iVar1 = *local_a08;
                *local_a08 = *local_a08 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_9f0 == (Mat *)0x0) {
                    if (local_a10 != (void *)0x0) {
                      free(local_a10);
                    }
                  }
                  else {
                    (**(code **)((long)local_9f0->data + 0x18))(local_9f0,local_a10);
                  }
                }
              }
              local_a10 = (void *)0x0;
              local_a00 = 0;
              local_9f8 = 0;
              local_9e8 = 0;
              local_9e4 = 0;
              local_9e0 = 0;
              local_9dc = 0;
              local_9d8 = 0;
              local_9d0 = 0;
              local_a08 = (int *)0x0;
              ppvVar4 = &local_980;
              local_600 = ppvVar4;
              if (local_978 != (int *)0x0) {
                LOCK();
                iVar1 = *local_978;
                *local_978 = *local_978 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_960 == (long *)0x0) {
                    if (local_980 != (void *)0x0) {
                      free(local_980);
                    }
                  }
                  else {
                    (**(code **)(*local_960 + 0x18))(local_960,local_980);
                  }
                }
              }
              *ppvVar4 = (void *)0x0;
              ppvVar4[2] = (void *)0x0;
              *(undefined4 *)(ppvVar4 + 3) = 0;
              *(undefined4 *)(ppvVar4 + 5) = 0;
              *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
              *(undefined4 *)(ppvVar4 + 6) = 0;
              *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
              *(undefined4 *)(ppvVar4 + 7) = 0;
              ppvVar4[8] = (void *)0x0;
              ppvVar4[1] = (void *)0x0;
            }
            if (in_stack_00000010 != 0) {
              transpose_unpack_output_tile
                        (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                         in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28,
                         (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                         (int)in_stack_fffffffffffffa20);
            }
          }
          puVar3 = (undefined8 *)&stack0xfffffffffffff738;
          local_5f0 = puVar3;
          if (A_00 != (Mat *)0x0) {
            LOCK();
            iVar1 = *(int *)&A_00->data;
            *(int *)&A_00->data = *(int *)&A_00->data + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (local_8a8 == (long *)0x0) {
                if (AT != (Mat *)0x0) {
                  free(AT);
                }
              }
              else {
                (**(code **)(*local_8a8 + 0x18))(local_8a8,AT);
              }
            }
          }
          *puVar3 = 0;
          puVar3[2] = 0;
          *(undefined4 *)(puVar3 + 3) = 0;
          *(undefined4 *)(puVar3 + 5) = 0;
          *(undefined4 *)((long)puVar3 + 0x2c) = 0;
          *(undefined4 *)(puVar3 + 6) = 0;
          *(undefined4 *)((long)puVar3 + 0x34) = 0;
          *(undefined4 *)(puVar3 + 7) = 0;
          puVar3[8] = 0;
          puVar3[1] = 0;
        }
        local_674 = 0;
      }
      local_720 = 1;
      if (local_860 != (int *)0x0) {
        LOCK();
        iVar1 = *local_860;
        *local_860 = *local_860 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_848 == (long *)0x0) {
            if (local_868 != (void *)0x0) {
              free(local_868);
            }
          }
          else {
            (**(code **)(*local_848 + 0x18))(local_848,local_868);
          }
        }
      }
      local_868 = (void *)0x0;
      local_858 = 0;
      local_850 = 0;
      local_840 = 0;
      local_83c = 0;
      local_838 = 0;
      local_834 = 0;
      local_830 = 0;
      local_828 = 0;
      local_860 = (int *)0x0;
    }
    if (local_760 != (int *)0x0) {
      LOCK();
      iVar1 = *local_760;
      *local_760 = *local_760 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_748 == (Mat *)0x0) {
          if (local_768 != (void *)0x0) {
            free(local_768);
          }
        }
        else {
          (**(code **)((long)local_748->data + 0x18))(local_748,local_768);
        }
      }
    }
    local_768 = (void *)0x0;
    local_758 = 0;
    local_750 = 0;
    local_740 = 0;
    local_73c = 0;
    local_738 = 0;
    local_734 = 0;
    local_730 = 0;
    local_728 = 0;
    local_760 = (int *)0x0;
  }
  if (local_708 != (int *)0x0) {
    LOCK();
    iVar1 = *local_708;
    *local_708 = *local_708 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_6f0 == (long *)0x0) {
        if (local_710 != (void *)0x0) {
          free(local_710);
        }
      }
      else {
        (**(code **)(*local_6f0 + 0x18))(local_6f0,local_710);
      }
    }
  }
  return local_674;
}

Assistant:

static int gemm_x86(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    if (ATX.empty())
        return -100;
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}